

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

int mod2sparse_equal(mod2sparse *m1,mod2sparse *m2)

{
  uint uVar1;
  mod2entry *pmVar2;
  ulong uVar3;
  ulong uVar4;
  mod2entry *pmVar5;
  
  uVar1 = m1->n_rows;
  if ((uVar1 != m2->n_rows) || (m1->n_cols != m2->n_cols)) {
    fwrite("mod2sparse_equal: Matrices have different dimensions\n",0x35,1,_stderr);
    exit(1);
  }
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar4 == uVar3) {
      return 1;
    }
    pmVar2 = m1->rows + uVar4;
    pmVar5 = m2->rows + uVar4;
    while( true ) {
      pmVar5 = pmVar5->right;
      pmVar2 = pmVar2->right;
      if (pmVar2->row < 0) break;
      if (pmVar5->row < 0) {
        return 0;
      }
      if (pmVar2->col != pmVar5->col) {
        return 0;
      }
    }
    uVar4 = uVar4 + 1;
    if (-1 < pmVar5->row) {
      return 0;
    }
  } while( true );
}

Assistant:

int mod2sparse_equal
( mod2sparse *m1,
  mod2sparse *m2
)
{
  mod2entry *e1, *e2;
  int i;

  if (mod2sparse_rows(m1)!=mod2sparse_rows(m2) 
   || mod2sparse_cols(m1)!=mod2sparse_cols(m2))
  { fprintf(stderr,"mod2sparse_equal: Matrices have different dimensions\n");
    exit(1);
  }
  
  for (i = 0; i<mod2sparse_rows(m1); i++)
  { 
    e1 = mod2sparse_first_in_row(m1,i);
    e2 = mod2sparse_first_in_row(m2,i);

    while (!mod2sparse_at_end(e1) && !mod2sparse_at_end(e2))
    {  
      if (mod2sparse_col(e1)!=mod2sparse_col(e2))
      { return 0;
      }

      e1 = mod2sparse_next_in_row(e1);
      e2 = mod2sparse_next_in_row(e2);
    }

    if (!mod2sparse_at_end(e1) || !mod2sparse_at_end(e2)) 
    { return 0;
    }
  }

  return 1;
}